

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lex.c
# Opt level: O0

void lex_string(LexState *ls,TValue *tv)

{
  int iVar1;
  LexChar LVar2;
  int iVar3;
  byte *pbVar4;
  byte bVar5;
  byte bVar6;
  GCstr *pGVar7;
  SBuf *pSVar8;
  uint local_424;
  uint local_420;
  uint local_41c;
  uint local_418;
  uint local_414;
  uint local_410;
  uint local_40c;
  uint local_408;
  uint local_404;
  uint local_400;
  uint local_3fc;
  uint local_3f8;
  uint local_3f4;
  uint local_3e4;
  uint local_3dc;
  uint local_3d8;
  LexChar c;
  LexChar delim;
  TValue *tv_local;
  LexState *ls_local;
  char *w;
  char *w_9;
  char *w_10;
  char *w_1;
  char *w_2;
  char *w_3;
  char *w_4;
  char *w_5;
  char *w_6;
  char *w_7;
  char *w_8;
  char *local_100;
  char *local_e8;
  char *local_d0;
  byte *local_b8;
  byte *local_a0;
  byte *local_88;
  byte *local_70;
  byte *local_58;
  char *local_40;
  char *local_28;
  char *local_10;
  
  iVar1 = ls->c;
  LVar2 = ls->c;
  pSVar8 = &ls->sb;
  if ((int)(ls->sb).e == (int)pSVar8->w) {
    local_10 = lj_buf_more2(pSVar8,1);
  }
  else {
    local_10 = pSVar8->w;
  }
  *local_10 = (char)LVar2;
  pSVar8->w = local_10 + 1;
  if (ls->p < ls->pe) {
    pbVar4 = (byte *)ls->p;
    ls->p = (char *)(pbVar4 + 1);
    local_3dc = (uint)*pbVar4;
  }
  else {
    local_3dc = lex_more(ls);
  }
  ls->c = local_3dc;
LAB_00132726:
  do {
    while( true ) {
      if (ls->c == iVar1) {
        LVar2 = ls->c;
        pSVar8 = &ls->sb;
        if ((int)(ls->sb).e == (int)pSVar8->w) {
          local_40 = lj_buf_more2(pSVar8,1);
        }
        else {
          local_40 = pSVar8->w;
        }
        *local_40 = (char)LVar2;
        pSVar8->w = local_40 + 1;
        if (ls->p < ls->pe) {
          pbVar4 = (byte *)ls->p;
          ls->p = (char *)(pbVar4 + 1);
          local_424 = (uint)*pbVar4;
        }
        else {
          local_424 = lex_more(ls);
        }
        ls->c = local_424;
        pGVar7 = lj_parse_keepstr(ls,(ls->sb).b + 1,(ulong)(((int)(ls->sb).w - (int)(ls->sb).b) - 2)
                                 );
        tv->u64 = (ulong)pGVar7 | 0xfffd800000000000;
        return;
      }
      iVar3 = ls->c;
      if (iVar3 == -1) {
        lj_lex_error(ls,0x121,LJ_ERR_XSTR);
      }
      if ((iVar3 == 10) || (iVar3 == 0xd)) {
        lj_lex_error(ls,0x120,LJ_ERR_XSTR);
      }
      if (iVar3 == 0x5c) break;
      LVar2 = ls->c;
      pSVar8 = &ls->sb;
      if ((int)(ls->sb).e == (int)pSVar8->w) {
        local_28 = lj_buf_more2(pSVar8,1);
      }
      else {
        local_28 = pSVar8->w;
      }
      *local_28 = (char)LVar2;
      pSVar8->w = local_28 + 1;
      if (ls->p < ls->pe) {
        pbVar4 = (byte *)ls->p;
        ls->p = (char *)(pbVar4 + 1);
        local_420 = (uint)*pbVar4;
      }
      else {
        local_420 = lex_more(ls);
      }
      ls->c = local_420;
    }
    if (ls->p < ls->pe) {
      pbVar4 = (byte *)ls->p;
      ls->p = (char *)(pbVar4 + 1);
      local_3e4 = (uint)*pbVar4;
    }
    else {
      local_3e4 = lex_more(ls);
    }
    ls->c = local_3e4;
    local_3d8 = local_3e4;
    switch(local_3e4) {
    default:
      if ((""[(long)(int)local_3e4 + 1] & 8) == 0) {
LAB_0013348c:
        lj_lex_error(ls,0x120,LJ_ERR_XESC);
      }
      local_3d8 = local_3e4 - 0x30;
      if (ls->p < ls->pe) {
        pbVar4 = (byte *)ls->p;
        ls->p = (char *)(pbVar4 + 1);
        local_410 = (uint)*pbVar4;
      }
      else {
        local_410 = lex_more(ls);
      }
      ls->c = local_410;
      if ((""[(long)(int)local_410 + 1] & 8) != 0) {
        local_3d8 = local_3d8 * 10 + ls->c + -0x30;
        if (ls->p < ls->pe) {
          pbVar4 = (byte *)ls->p;
          ls->p = (char *)(pbVar4 + 1);
          local_414 = (uint)*pbVar4;
        }
        else {
          local_414 = lex_more(ls);
        }
        ls->c = local_414;
        if ((""[(long)(int)local_414 + 1] & 8) != 0) {
          local_3d8 = local_3d8 * 10 + ls->c + -0x30;
          if (0xff < (int)local_3d8) goto LAB_0013348c;
          if (ls->p < ls->pe) {
            pbVar4 = (byte *)ls->p;
            ls->p = (char *)(pbVar4 + 1);
            local_418 = (uint)*pbVar4;
          }
          else {
            local_418 = lex_more(ls);
          }
          ls->c = local_418;
        }
      }
      pSVar8 = &ls->sb;
      if ((int)(ls->sb).e == (int)pSVar8->w) {
        local_e8 = lj_buf_more2(pSVar8,1);
      }
      else {
        local_e8 = pSVar8->w;
      }
      *local_e8 = (char)local_3d8;
      pSVar8->w = local_e8 + 1;
      goto LAB_00132726;
    case 10:
    case 0xd:
      pSVar8 = &ls->sb;
      if ((int)(ls->sb).e == (int)pSVar8->w) {
        local_d0 = lj_buf_more2(pSVar8,1);
      }
      else {
        local_d0 = pSVar8->w;
      }
      *local_d0 = '\n';
      pSVar8->w = local_d0 + 1;
      lex_newline(ls);
      goto LAB_00132726;
    case 0x22:
    case 0x27:
    case 0x5c:
      break;
    case 0x61:
      local_3d8 = 7;
      break;
    case 0x62:
      local_3d8 = 8;
      break;
    case 0x66:
      local_3d8 = 0xc;
      break;
    case 0x6e:
      local_3d8 = 10;
      break;
    case 0x72:
      local_3d8 = 0xd;
      break;
    case 0x74:
      local_3d8 = 9;
      break;
    case 0x75:
      if (ls->p < ls->pe) {
        pbVar4 = (byte *)ls->p;
        ls->p = (char *)(pbVar4 + 1);
        local_3fc = (uint)*pbVar4;
      }
      else {
        local_3fc = lex_more(ls);
      }
      ls->c = local_3fc;
      if (local_3fc != 0x7b) goto LAB_0013348c;
      if (ls->p < ls->pe) {
        pbVar4 = (byte *)ls->p;
        ls->p = (char *)(pbVar4 + 1);
        local_400 = (uint)*pbVar4;
      }
      else {
        local_400 = lex_more(ls);
      }
      ls->c = local_400;
      local_3d8 = 0;
      do {
        local_3d8 = local_3d8 << 4 | ls->c & 0xfU;
        if ((""[(long)ls->c + 1] & 8) == 0) {
          if ((""[(long)ls->c + 1] & 0x10) == 0) goto LAB_0013348c;
          local_3d8 = local_3d8 + 9;
        }
        if (0x10ffff < (int)local_3d8) goto LAB_0013348c;
        if (ls->p < ls->pe) {
          pbVar4 = (byte *)ls->p;
          ls->p = (char *)(pbVar4 + 1);
          local_404 = (uint)*pbVar4;
        }
        else {
          local_404 = lex_more(ls);
        }
        ls->c = local_404;
      } while (local_404 != 0x7d);
      bVar5 = (byte)((int)local_3d8 >> 6);
      if ((int)local_3d8 < 0x800) {
        if ((int)local_3d8 < 0x80) break;
        pSVar8 = &ls->sb;
        if ((int)(ls->sb).e == (int)pSVar8->w) {
          local_58 = (byte *)lj_buf_more2(pSVar8,1);
        }
        else {
          local_58 = (byte *)pSVar8->w;
        }
        *local_58 = bVar5 | 0xc0;
        pSVar8->w = (char *)(local_58 + 1);
      }
      else {
        bVar6 = (byte)((int)local_3d8 >> 0xc);
        if ((int)local_3d8 < 0x10000) {
          if ((0xd7ff < (int)local_3d8) && ((int)local_3d8 < 0xe000)) goto LAB_0013348c;
          pSVar8 = &ls->sb;
          if ((int)(ls->sb).e == (int)pSVar8->w) {
            local_a0 = (byte *)lj_buf_more2(pSVar8,1);
          }
          else {
            local_a0 = (byte *)pSVar8->w;
          }
          *local_a0 = bVar6 | 0xe0;
          pSVar8->w = (char *)(local_a0 + 1);
        }
        else {
          pSVar8 = &ls->sb;
          if ((int)(ls->sb).e == (int)pSVar8->w) {
            local_70 = (byte *)lj_buf_more2(pSVar8,1);
          }
          else {
            local_70 = (byte *)pSVar8->w;
          }
          *local_70 = (byte)((int)local_3d8 >> 0x12) | 0xf0;
          pSVar8->w = (char *)(local_70 + 1);
          pSVar8 = &ls->sb;
          if ((int)(ls->sb).e == (int)pSVar8->w) {
            local_88 = (byte *)lj_buf_more2(pSVar8,1);
          }
          else {
            local_88 = (byte *)pSVar8->w;
          }
          *local_88 = bVar6 & 0x3f | 0x80;
          pSVar8->w = (char *)(local_88 + 1);
        }
        pSVar8 = &ls->sb;
        if ((int)(ls->sb).e == (int)pSVar8->w) {
          local_b8 = (byte *)lj_buf_more2(pSVar8,1);
        }
        else {
          local_b8 = (byte *)pSVar8->w;
        }
        *local_b8 = bVar5 & 0x3f | 0x80;
        pSVar8->w = (char *)(local_b8 + 1);
      }
      local_3d8 = local_3d8 & 0x3f | 0x80;
      break;
    case 0x76:
      local_3d8 = 0xb;
      break;
    case 0x78:
      if (ls->p < ls->pe) {
        pbVar4 = (byte *)ls->p;
        ls->p = (char *)(pbVar4 + 1);
        local_3f4 = (uint)*pbVar4;
      }
      else {
        local_3f4 = lex_more(ls);
      }
      ls->c = local_3f4;
      local_3d8 = (local_3f4 & 0xf) * 0x10;
      if ((""[(long)ls->c + 1] & 8) == 0) {
        if ((""[(long)ls->c + 1] & 0x10) == 0) goto LAB_0013348c;
        local_3d8 = local_3d8 + 0x90;
      }
      if (ls->p < ls->pe) {
        pbVar4 = (byte *)ls->p;
        ls->p = (char *)(pbVar4 + 1);
        local_3f8 = (uint)*pbVar4;
      }
      else {
        local_3f8 = lex_more(ls);
      }
      ls->c = local_3f8;
      local_3d8 = (local_3f8 & 0xf) + local_3d8;
      if ((""[(long)ls->c + 1] & 8) == 0) {
        if ((""[(long)ls->c + 1] & 0x10) == 0) goto LAB_0013348c;
        local_3d8 = local_3d8 + 9;
      }
      break;
    case 0x7a:
      goto switchD_0013284b_caseD_7a;
    case 0xffffffff:
      goto LAB_00132726;
    }
    pSVar8 = &ls->sb;
    if ((int)(ls->sb).e == (int)pSVar8->w) {
      local_100 = lj_buf_more2(pSVar8,1);
    }
    else {
      local_100 = pSVar8->w;
    }
    *local_100 = (char)local_3d8;
    pSVar8->w = local_100 + 1;
    if (ls->p < ls->pe) {
      pbVar4 = (byte *)ls->p;
      ls->p = (char *)(pbVar4 + 1);
      local_41c = (uint)*pbVar4;
    }
    else {
      local_41c = lex_more(ls);
    }
    ls->c = local_41c;
  } while( true );
switchD_0013284b_caseD_7a:
  if (ls->p < ls->pe) {
    pbVar4 = (byte *)ls->p;
    ls->p = (char *)(pbVar4 + 1);
    local_408 = (uint)*pbVar4;
  }
  else {
    local_408 = lex_more(ls);
  }
  ls->c = local_408;
  while ((""[(long)ls->c + 1] & 2) != 0) {
    if ((ls->c == 10) || (ls->c == 0xd)) {
      lex_newline(ls);
    }
    else {
      if (ls->p < ls->pe) {
        pbVar4 = (byte *)ls->p;
        ls->p = (char *)(pbVar4 + 1);
        local_40c = (uint)*pbVar4;
      }
      else {
        local_40c = lex_more(ls);
      }
      ls->c = local_40c;
    }
  }
  goto LAB_00132726;
}

Assistant:

static void lex_string(LexState *ls, TValue *tv)
{
  LexChar delim = ls->c;  /* Delimiter is '\'' or '"'. */
  lex_savenext(ls);
  while (ls->c != delim) {
    switch (ls->c) {
    case LEX_EOF:
      lj_lex_error(ls, TK_eof, LJ_ERR_XSTR);
      continue;
    case '\n':
    case '\r':
      lj_lex_error(ls, TK_string, LJ_ERR_XSTR);
      continue;
    case '\\': {
      LexChar c = lex_next(ls);  /* Skip the '\\'. */
      switch (c) {
      case 'a': c = '\a'; break;
      case 'b': c = '\b'; break;
      case 'f': c = '\f'; break;
      case 'n': c = '\n'; break;
      case 'r': c = '\r'; break;
      case 't': c = '\t'; break;
      case 'v': c = '\v'; break;
      case 'x':  /* Hexadecimal escape '\xXX'. */
	c = (lex_next(ls) & 15u) << 4;
	if (!lj_char_isdigit(ls->c)) {
	  if (!lj_char_isxdigit(ls->c)) goto err_xesc;
	  c += 9 << 4;
	}
	c += (lex_next(ls) & 15u);
	if (!lj_char_isdigit(ls->c)) {
	  if (!lj_char_isxdigit(ls->c)) goto err_xesc;
	  c += 9;
	}
	break;
      case 'u':  /* Unicode escape '\u{XX...}'. */
	if (lex_next(ls) != '{') goto err_xesc;
	lex_next(ls);
	c = 0;
	do {
	  c = (c << 4) | (ls->c & 15u);
	  if (!lj_char_isdigit(ls->c)) {
	    if (!lj_char_isxdigit(ls->c)) goto err_xesc;
	    c += 9;
	  }
	  if (c >= 0x110000) goto err_xesc;  /* Out of Unicode range. */
	} while (lex_next(ls) != '}');
	if (c < 0x800) {
	  if (c < 0x80) break;
	  lex_save(ls, 0xc0 | (c >> 6));
	} else {
	  if (c >= 0x10000) {
	    lex_save(ls, 0xf0 | (c >> 18));
	    lex_save(ls, 0x80 | ((c >> 12) & 0x3f));
	  } else {
	    if (c >= 0xd800 && c < 0xe000) goto err_xesc;  /* No surrogates. */
	    lex_save(ls, 0xe0 | (c >> 12));
	  }
	  lex_save(ls, 0x80 | ((c >> 6) & 0x3f));
	}
	c = 0x80 | (c & 0x3f);
	break;
      case 'z':  /* Skip whitespace. */
	lex_next(ls);
	while (lj_char_isspace(ls->c))
	  if (lex_iseol(ls)) lex_newline(ls); else lex_next(ls);
	continue;
      case '\n': case '\r': lex_save(ls, '\n'); lex_newline(ls); continue;
      case '\\': case '\"': case '\'': break;
      case LEX_EOF: continue;
      default:
	if (!lj_char_isdigit(c))
	  goto err_xesc;
	c -= '0';  /* Decimal escape '\ddd'. */
	if (lj_char_isdigit(lex_next(ls))) {
	  c = c*10 + (ls->c - '0');
	  if (lj_char_isdigit(lex_next(ls))) {
	    c = c*10 + (ls->c - '0');
	    if (c > 255) {
	    err_xesc:
	      lj_lex_error(ls, TK_string, LJ_ERR_XESC);
	    }
	    lex_next(ls);
	  }
	}
	lex_save(ls, c);
	continue;
      }
      lex_save(ls, c);
      lex_next(ls);
      continue;
      }
    default:
      lex_savenext(ls);
      break;
    }
  }
  lex_savenext(ls);  /* Skip trailing delimiter. */
  setstrV(ls->L, tv,
	  lj_parse_keepstr(ls, ls->sb.b+1, sbuflen(&ls->sb)-2));
}